

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_digest.c
# Opt level: O1

void hexdump(void *ptr,size_t len)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  
  if (len != 0) {
    uVar1 = 0;
    do {
      lVar3 = 0;
      do {
        if (len <= lVar3 + uVar1) break;
        pcVar2 = "";
        if (lVar3 == 0) {
          pcVar2 = " ";
        }
        printf("%s%02x",pcVar2,(ulong)*(byte *)((long)ptr + lVar3 + uVar1));
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      uVar1 = uVar1 + lVar3;
    } while (uVar1 < len);
  }
  putchar(10);
  return;
}

Assistant:

static void hexdump(const void *ptr, size_t len)
{
    const unsigned char *p = ptr;
    size_t i, j;

    for (i = 0; i < len; i += j) {
	for (j = 0; j < 16 && i + j < len; j++)
	    printf("%s%02x", j? "" : " ", p[i + j]);
    }
    printf("\n");
}